

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_bit_reverse.c
# Opt level: O0

void WebRtcSpl_ComplexBitReverse(int16_t *complex_data,int stages)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int32_t temp_1;
  int32_t *complex_data_ptr_1;
  int nn;
  int n;
  int l;
  int mr;
  int m_1;
  int32_t temp;
  int32_t *complex_data_ptr;
  int16_t *index;
  int local_18;
  int length;
  int m;
  int stages_local;
  int16_t *complex_data_local;
  
  if ((stages == 7) || (stages == 8)) {
    index._4_4_ = 0x70;
    complex_data_ptr = (int32_t *)index_7;
    if (stages == 8) {
      index._4_4_ = 0xf0;
      complex_data_ptr = (int32_t *)index_8;
    }
    for (local_18 = 0; local_18 < index._4_4_; local_18 = local_18 + 2) {
      uVar1 = *(undefined4 *)
               (complex_data + (long)*(short *)((long)complex_data_ptr + (long)local_18 * 2) * 2);
      *(undefined4 *)
       (complex_data + (long)*(short *)((long)complex_data_ptr + (long)local_18 * 2) * 2) =
           *(undefined4 *)
            (complex_data + (long)*(short *)((long)complex_data_ptr + (long)(local_18 + 1) * 2) * 2)
      ;
      *(undefined4 *)
       (complex_data + (long)*(short *)((long)complex_data_ptr + (long)(local_18 + 1) * 2) * 2) =
           uVar1;
    }
  }
  else {
    n = 0;
    iVar2 = 1 << ((byte)stages & 0x1f);
    iVar3 = iVar2 + -1;
    for (l = 1; nn = iVar2, l <= iVar3; l = l + 1) {
      do {
        nn = nn >> 1;
      } while (iVar3 - n < nn);
      n = (n & nn - 1U) + nn;
      if (l < n) {
        uVar1 = *(undefined4 *)(complex_data + (long)l * 2);
        *(undefined4 *)(complex_data + (long)l * 2) = *(undefined4 *)(complex_data + (long)n * 2);
        *(undefined4 *)(complex_data + (long)n * 2) = uVar1;
      }
    }
  }
  return;
}

Assistant:

void WebRtcSpl_ComplexBitReverse(int16_t* __restrict complex_data, int stages) {
  /* For any specific value of stages, we know exactly the indexes that are
   * bit reversed. Currently (Feb. 2012) in WebRTC the only possible values of
   * stages are 7 and 8, so we use tables to save unnecessary iterations and
   * calculations for these two cases.
   */
  if (stages == 7 || stages == 8) {
    int m = 0;
    int length = 112;
    const int16_t* index = index_7;

    if (stages == 8) {
      length = 240;
      index = index_8;
    }

    /* Decimation in time. Swap the elements with bit-reversed indexes. */
    for (m = 0; m < length; m += 2) {
      /* We declare a int32_t* type pointer, to load both the 16-bit real
       * and imaginary elements from complex_data in one instruction, reducing
       * complexity.
       */
      int32_t* complex_data_ptr = (int32_t*)complex_data;
      int32_t temp = 0;

      temp = complex_data_ptr[index[m]];  /* Real and imaginary */
      complex_data_ptr[index[m]] = complex_data_ptr[index[m + 1]];
      complex_data_ptr[index[m + 1]] = temp;
    }
  }
  else {
    int m = 0, mr = 0, l = 0;
    int n = 1 << stages;
    int nn = n - 1;

    /* Decimation in time - re-order data */
    for (m = 1; m <= nn; ++m) {
      int32_t* complex_data_ptr = (int32_t*)complex_data;
      int32_t temp = 0;

      /* Find out indexes that are bit-reversed. */
      l = n;
      do {
        l >>= 1;
      } while (l > nn - mr);
      mr = (mr & (l - 1)) + l;

      if (mr <= m) {
        continue;
      }

      /* Swap the elements with bit-reversed indexes.
       * This is similar to the loop in the stages == 7 or 8 cases.
       */
      temp = complex_data_ptr[m];  /* Real and imaginary */
      complex_data_ptr[m] = complex_data_ptr[mr];
      complex_data_ptr[mr] = temp;
    }
  }
}